

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_source_element(JSParseState *s)

{
  uint uVar1;
  JSFunctionDef *pJVar2;
  JSModuleDef *pJVar3;
  JSAtomStruct *pJVar4;
  JSParseExportEnum export_flag;
  BOOL BVar5;
  int iVar6;
  JSAtom import_name;
  int iVar7;
  JSAtom JVar8;
  long lVar9;
  JSExportEntry *pJVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  char *fmt;
  JSContext *ctx;
  int in_R9D;
  JSFunctionDef **in_stack_ffffffffffffffc0;
  
  iVar6 = (s->token).val;
  iVar12 = -1;
  if (iVar6 == -0x3b) {
LAB_0014521b:
    iVar6 = js_parse_function_decl
                      (s,JS_PARSE_FUNC_STATEMENT,JS_FUNC_NORMAL,(JSAtom)(s->token).ptr,
                       (uint8_t *)(ulong)(uint)(s->token).line_num,in_R9D);
    goto LAB_001452b4;
  }
  pJVar2 = s->cur_func;
  BVar5 = token_is_pseudo_keyword(s,0x85);
  if (BVar5 != 0) {
    iVar6 = peek_token(s,1);
    if (iVar6 == -0x3b) goto LAB_0014521b;
    iVar6 = (s->token).val;
  }
  if (iVar6 == -0x33) {
    if (((pJVar2->module == (JSModuleDef *)0x0) || (iVar6 = peek_token(s,0), iVar6 == 0x28)) ||
       (iVar6 == 0x2e)) goto LAB_001452a9;
    ctx = s->ctx;
    pJVar3 = s->cur_func->module;
    iVar6 = next_token(s);
    if (iVar6 != 0) {
      return -1;
    }
    lVar9 = (long)pJVar3->import_entries_count;
    iVar6 = (s->token).val;
    if (iVar6 == -0x7d) {
      if ((s->token).u.ident.is_reserved != 0) {
        js_parse_error_reserved_identifier(s);
        return -1;
      }
      JVar8 = (s->token).u.ident.atom;
      if (0xd1 < (long)(int)JVar8) {
        pJVar4 = ctx->rt->atom_array[(int)JVar8];
        (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
      }
      iVar6 = next_token(s);
      import_name = 0x16;
      if ((iVar6 != 0) || (iVar6 = add_import(s,pJVar3,JVar8,0x16), iVar6 != 0)) goto LAB_0014554a;
      JS_FreeAtom(ctx,JVar8);
      if ((s->token).val == 0x2c) {
        iVar6 = next_token(s);
        if (iVar6 != 0) {
          return -1;
        }
        iVar6 = (s->token).val;
        goto LAB_001456b2;
      }
LAB_00145939:
      import_name = js_parse_from_clause(s);
      if (import_name == 0) {
        return -1;
      }
    }
    else {
      if (iVar6 != -0x7f) {
LAB_001456b2:
        if (iVar6 == 0x7b) {
          iVar6 = next_token(s);
          while( true ) {
            if (iVar6 != 0) {
              return -1;
            }
            iVar6 = (s->token).val;
            if (iVar6 == 0x7d) break;
            if (iVar6 + 0x27U < 0xffffffd2 && iVar6 != -0x7d) goto LAB_00145713;
            import_name = (s->token).u.ident.atom;
            lVar13 = (long)(int)import_name;
            if (0xd1 < lVar13) {
              pJVar4 = ctx->rt->atom_array[lVar13];
              (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
            }
            iVar6 = next_token(s);
            JVar8 = 0;
            if (iVar6 != 0) goto LAB_0014554a;
            BVar5 = token_is_pseudo_keyword(s,0x79);
            if (BVar5 == 0) {
              JVar8 = import_name;
              if (0xd1 < (int)import_name) {
                pJVar4 = ctx->rt->atom_array[lVar13];
                (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
              }
            }
            else {
              iVar6 = next_token(s);
              if (iVar6 != 0) goto LAB_0014554a;
              iVar6 = (s->token).val;
              if (iVar6 + 0x27U < 0xffffffd2 && iVar6 != -0x7d) {
                JVar8 = 0;
                js_parse_error(s,"identifier expected");
                goto LAB_0014554a;
              }
              JVar8 = (s->token).u.ident.atom;
              if (0xd1 < (long)(int)JVar8) {
                pJVar4 = ctx->rt->atom_array[(int)JVar8];
                (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
              }
              iVar6 = next_token(s);
              if (iVar6 != 0) goto LAB_0014554a;
            }
            iVar6 = add_import(s,pJVar3,JVar8,import_name);
            if (iVar6 != 0) goto LAB_0014554a;
            JS_FreeAtom(ctx,JVar8);
            JS_FreeAtom(ctx,import_name);
            if ((s->token).val != 0x2c) break;
            iVar6 = next_token(s);
          }
          iVar6 = js_parse_expect(s,0x7d);
          if (iVar6 != 0) {
            return -1;
          }
        }
        else if (iVar6 == 0x2a) {
          iVar6 = next_token(s);
          if (iVar6 != 0) {
            return -1;
          }
          BVar5 = token_is_pseudo_keyword(s,0x79);
          if (BVar5 == 0) {
            fmt = "expecting \'as\'";
            goto LAB_0014586f;
          }
          iVar6 = next_token(s);
          if (iVar6 != 0) {
            return -1;
          }
          iVar6 = (s->token).val;
          if (iVar6 + 0x27U < 0xffffffd2 && iVar6 != -0x7d) {
LAB_00145713:
            fmt = "identifier expected";
LAB_0014586f:
            js_parse_error(s,fmt);
            return -1;
          }
          JVar8 = (s->token).u.ident.atom;
          if (0xd1 < (long)(int)JVar8) {
            pJVar4 = ctx->rt->atom_array[(int)JVar8];
            (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
          }
          iVar6 = next_token(s);
          if (iVar6 == 0) {
            import_name = 0x7d;
            iVar6 = add_import(s,pJVar3,JVar8,0x7d);
            if (iVar6 == 0) {
              JS_FreeAtom(ctx,JVar8);
              goto LAB_00145939;
            }
          }
          else {
            import_name = 0x7d;
          }
LAB_0014554a:
          JS_FreeAtom(ctx,JVar8);
LAB_0014555f:
          JS_FreeAtom(ctx,import_name);
          return -1;
        }
        goto LAB_00145939;
      }
      import_name = JS_ValueToAtom(ctx,(s->token).u.str.str);
      if (import_name == 0) {
        return -1;
      }
      iVar6 = next_token(s);
      if (iVar6 != 0) goto LAB_0014555f;
    }
    iVar6 = add_req_module_entry(ctx,pJVar3,import_name);
    JS_FreeAtom(ctx,import_name);
    if (iVar6 < 0) {
      return -1;
    }
    iVar7 = pJVar3->import_entries_count;
    lVar13 = lVar9 * 0xc + 8;
    for (; lVar9 < iVar7; lVar9 = lVar9 + 1) {
      *(int *)((long)&pJVar3->import_entries->var_idx + lVar13) = iVar6;
      lVar13 = lVar13 + 0xc;
    }
  }
  else {
    if ((iVar6 != -0x35) || (pJVar2->module == (JSModuleDef *)0x0)) {
LAB_001452a9:
      iVar6 = js_parse_statement_or_decl(s,7);
      goto LAB_001452b4;
    }
    ctx = s->ctx;
    pJVar3 = s->cur_func->module;
    iVar6 = next_token(s);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = (s->token).val;
    if (iVar6 == -0x3b) {
LAB_00145351:
      JVar8 = (JSAtom)(s->token).ptr;
      uVar1 = (s->token).line_num;
      iVar6 = 1;
LAB_00145360:
      iVar6 = js_parse_function_decl2
                        (s,JS_PARSE_FUNC_STATEMENT,JS_FUNC_NORMAL,JVar8,(uint8_t *)(ulong)uVar1,
                         iVar6,JS_PARSE_EXPORT_NONE,in_stack_ffffffffffffffc0);
      goto LAB_001452b4;
    }
    if (iVar6 == -0x38) {
      export_flag = JS_PARSE_EXPORT_NAMED;
LAB_0014527e:
      iVar6 = js_parse_class(s,0,export_flag);
      goto LAB_001452b4;
    }
    BVar5 = token_is_pseudo_keyword(s,0x85);
    if ((BVar5 != 0) && (iVar7 = peek_token(s,1), iVar7 == -0x3b)) goto LAB_00145351;
    iVar7 = next_token(s);
    if (iVar7 != 0) {
      return -1;
    }
    if (iVar6 == -0x4f) {
LAB_00145569:
      iVar6 = js_parse_var(s,1,iVar6,1);
      goto LAB_001452b4;
    }
    if (iVar6 == -0x40) {
      iVar6 = (s->token).val;
      if (iVar6 != -0x3b) {
        if (iVar6 == -0x38) {
          export_flag = JS_PARSE_EXPORT_DEFAULT;
          goto LAB_0014527e;
        }
        BVar5 = token_is_pseudo_keyword(s,0x85);
        if ((BVar5 == 0) || (iVar6 = peek_token(s,1), iVar6 != -0x3b)) {
          iVar6 = js_parse_assign_expr(s);
          if (iVar6 != 0) {
            return -1;
          }
          set_object_name(s,0x16);
          iVar6 = define_var(s,s->cur_func,0x7c,JS_VAR_DEF_LET);
          if (iVar6 < 0) {
            return -1;
          }
          emit_op(s,0xbb);
          emit_u32(s,0x7c);
          emit_u16(s,0);
          pJVar10 = add_export_entry(s,pJVar3,0x7c,0x16,JS_EXPORT_TYPE_LOCAL);
          if (pJVar10 == (JSExportEntry *)0x0) {
            return -1;
          }
          goto LAB_00145a9b;
        }
      }
      JVar8 = (JSAtom)(s->token).ptr;
      uVar1 = (s->token).line_num;
      iVar6 = 2;
      goto LAB_00145360;
    }
    if ((iVar6 == -0x37) || (iVar6 == -0x2f)) goto LAB_00145569;
    if (iVar6 != 0x2a) {
      if (iVar6 == 0x7b) {
        lVar9 = (long)pJVar3->export_entries_count;
        do {
          iVar6 = (s->token).val;
          if (iVar6 == 0x7d) {
LAB_00145996:
            iVar6 = js_parse_expect(s,0x7d);
            if (iVar6 != 0) {
              return -1;
            }
            BVar5 = token_is_pseudo_keyword(s,0x7a);
            if (BVar5 != 0) {
              JVar8 = js_parse_from_clause(s);
              if (JVar8 == 0) {
                return -1;
              }
              iVar6 = add_req_module_entry(ctx,pJVar3,JVar8);
              JS_FreeAtom(ctx,JVar8);
              if (iVar6 < 0) {
                return -1;
              }
              uVar11 = lVar9 << 5 | 0x10;
              for (; lVar9 < pJVar3->export_entries_count; lVar9 = lVar9 + 1) {
                pJVar10 = pJVar3->export_entries;
                *(undefined4 *)((long)&pJVar10->u + uVar11) = 1;
                *(int *)((long)pJVar10 + (uVar11 - 0x10)) = iVar6;
                uVar11 = uVar11 + 0x20;
              }
            }
            goto LAB_00145a9b;
          }
          if (iVar6 + 0x27U < 0xffffffd2 && iVar6 != -0x7d) goto LAB_00145713;
          JVar8 = (s->token).u.ident.atom;
          lVar13 = (long)(int)JVar8;
          if (0xd1 < lVar13) {
            pJVar4 = ctx->rt->atom_array[lVar13];
            (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
          }
          iVar6 = next_token(s);
          import_name = 0;
          if (iVar6 != 0) {
LAB_00145b16:
            JS_FreeAtom(ctx,JVar8);
            goto LAB_0014555f;
          }
          BVar5 = token_is_pseudo_keyword(s,0x79);
          if (BVar5 != 0) {
            iVar6 = next_token(s);
            if (iVar6 == 0) {
              iVar6 = (s->token).val;
              if (iVar6 + 0x27U < 0xffffffd2 && iVar6 != -0x7d) {
                import_name = 0;
                js_parse_error(s,"identifier expected");
              }
              else {
                import_name = (s->token).u.ident.atom;
                if (0xd1 < (long)(int)import_name) {
                  pJVar4 = ctx->rt->atom_array[(int)import_name];
                  (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
                }
                iVar6 = next_token(s);
                if (iVar6 == 0) goto LAB_00145499;
              }
            }
            goto LAB_00145b16;
          }
          import_name = JVar8;
          if (0xd1 < (int)JVar8) {
            pJVar4 = ctx->rt->atom_array[lVar13];
            (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
          }
LAB_00145499:
          pJVar10 = add_export_entry(s,pJVar3,JVar8,import_name,JS_EXPORT_TYPE_LOCAL);
          JS_FreeAtom(ctx,JVar8);
          JS_FreeAtom(ctx,import_name);
          if (pJVar10 == (JSExportEntry *)0x0) {
            return -1;
          }
          if ((s->token).val != 0x2c) goto LAB_00145996;
          iVar6 = next_token(s);
          if (iVar6 != 0) {
            return -1;
          }
        } while( true );
      }
      fmt = "invalid export syntax";
      goto LAB_0014586f;
    }
    BVar5 = token_is_pseudo_keyword(s,0x79);
    if (BVar5 == 0) {
      JVar8 = js_parse_from_clause(s);
      if (JVar8 == 0) {
        return -1;
      }
      iVar6 = add_req_module_entry(ctx,pJVar3,JVar8);
      JS_FreeAtom(ctx,JVar8);
      if (iVar6 < 0) {
        return -1;
      }
      iVar7 = js_resize_array(ctx,&pJVar3->star_export_entries,4,&pJVar3->star_export_entries_size,
                              pJVar3->star_export_entries_count + 1);
      if (iVar7 != 0) {
        return -1;
      }
      iVar7 = pJVar3->star_export_entries_count;
      pJVar3->star_export_entries_count = iVar7 + 1;
      pJVar3->star_export_entries[iVar7].req_module_idx = iVar6;
    }
    else {
      iVar6 = next_token(s);
      if (iVar6 != 0) {
        return -1;
      }
      iVar6 = (s->token).val;
      if (iVar6 + 0x27U < 0xffffffd2 && iVar6 != -0x7d) goto LAB_00145713;
      import_name = (s->token).u.ident.atom;
      if (0xd1 < (long)(int)import_name) {
        pJVar4 = ctx->rt->atom_array[(int)import_name];
        (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
      }
      iVar6 = next_token(s);
      if ((iVar6 != 0) || (JVar8 = js_parse_from_clause(s), JVar8 == 0)) goto LAB_0014555f;
      iVar6 = add_req_module_entry(ctx,pJVar3,JVar8);
      JS_FreeAtom(ctx,JVar8);
      if (iVar6 < 0) goto LAB_0014555f;
      pJVar10 = add_export_entry(s,pJVar3,0x7d,import_name,JS_EXPORT_TYPE_INDIRECT);
      JS_FreeAtom(ctx,import_name);
      if (pJVar10 == (JSExportEntry *)0x0) {
        return -1;
      }
      (pJVar10->u).local.var_idx = iVar6;
    }
  }
LAB_00145a9b:
  iVar6 = js_parse_expect_semi(s);
LAB_001452b4:
  if (iVar6 == 0) {
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static __exception int js_parse_source_element(JSParseState *s)
{
    JSFunctionDef *fd = s->cur_func;
    int tok;
    
    if (s->token.val == TOK_FUNCTION ||
        (token_is_pseudo_keyword(s, JS_ATOM_async) &&
         peek_token(s, TRUE) == TOK_FUNCTION)) {
        if (js_parse_function_decl(s, JS_PARSE_FUNC_STATEMENT,
                                   JS_FUNC_NORMAL, JS_ATOM_NULL,
                                   s->token.ptr, s->token.line_num))
            return -1;
    } else if (s->token.val == TOK_EXPORT && fd->module) {
        if (js_parse_export(s))
            return -1;
    } else if (s->token.val == TOK_IMPORT && fd->module &&
               ((tok = peek_token(s, FALSE)) != '(' && tok != '.'))  {
        /* the peek_token is needed to avoid confusion with ImportCall
           (dynamic import) or import.meta */
        if (js_parse_import(s))
            return -1;
    } else {
        if (js_parse_statement_or_decl(s, DECL_MASK_ALL))
            return -1;
    }
    return 0;
}